

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

int scale_LUT(int *scaling_lut,int index,int bit_depth)

{
  char cVar1;
  int iVar2;
  int x;
  int bit_depth_local;
  int index_local;
  int *scaling_lut_local;
  int local_4;
  
  cVar1 = (char)bit_depth;
  iVar2 = index >> (cVar1 - 8U & 0x1f);
  if ((bit_depth == 8) || (iVar2 == 0xff)) {
    local_4 = scaling_lut[iVar2];
  }
  else {
    local_4 = scaling_lut[iVar2] +
              ((int)((scaling_lut[iVar2 + 1] - scaling_lut[iVar2]) *
                     (index & (1 << (cVar1 - 8U & 0x1f)) - 1U) + (1 << (cVar1 - 9U & 0x1f))) >>
              (cVar1 - 8U & 0x1f));
  }
  return local_4;
}

Assistant:

static int scale_LUT(int *scaling_lut, int index, int bit_depth) {
  int x = index >> (bit_depth - 8);

  if (!(bit_depth - 8) || x == 255)
    return scaling_lut[x];
  else
    return scaling_lut[x] + (((scaling_lut[x + 1] - scaling_lut[x]) *
                                  (index & ((1 << (bit_depth - 8)) - 1)) +
                              (1 << (bit_depth - 9))) >>
                             (bit_depth - 8));
}